

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  GLFWmonitor *pGVar6;
  GLFWvidmode *pGVar7;
  ostream *poVar8;
  GLFWwindow *handle;
  undefined8 uVar9;
  int lineNo;
  int lineNo_00;
  int lineNo_01;
  long lVar10;
  int height;
  Renderer renderer;
  MesmerizeOptions options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  picturePaths;
  ManualTicker manualTicker;
  runtime_error e;
  Renderer local_209;
  undefined1 local_208 [4];
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  float fStack_1ec;
  float local_1e8;
  string local_1e0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  _Any_data local_180;
  code *local_170;
  undefined1 local_138 [40];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  if (argc != 1) {
    MesmerizeOptions::MesmerizeOptions((MesmerizeOptions *)local_208);
    MesmerizeOptions::FromArgs((MesmerizeOptions *)local_138,argc,argv);
    local_1e8 = (float)local_138._32_4_;
    _local_1f8 = local_138._16_8_;
    _iStack_1f0 = local_138._24_8_;
    _local_208 = local_138._0_8_;
    _iStack_200 = local_138._8_8_;
    std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != local_100) {
      operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
    }
    GetShuffledPicturePaths::GetShuffledPicturePaths(&local_198,&local_1e0);
    if (local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Folder ",7);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1e0._M_dataplus._M_p,
                          local_1e0._M_string_length);
      iVar5 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," has no pictures (.jpg or .png)\n",0x20);
    }
    else {
      PictureRendererWithTransition::PictureRendererWithTransition
                ((PictureRendererWithTransition *)local_138,iStack_1f0,iStack_1f4,local_1f8,
                 local_1e8,fStack_1ec);
      iVar4 = glfwInit();
      iVar5 = -1;
      if (iVar4 != 0) {
        pGVar6 = glfwGetPrimaryMonitor();
        pGVar7 = glfwGetVideoMode(pGVar6);
        iVar4 = pGVar7->width;
        height = pGVar7->height;
        iVar1 = iStack_204;
        iVar2 = iStack_200;
        if (local_208[0] == true) {
          if (local_208[1] == false) {
            pGVar6 = glfwGetPrimaryMonitor();
            iVar4 = iVar1;
            height = iVar2;
          }
          else {
            pGVar6 = glfwGetPrimaryMonitor();
          }
        }
        else if (local_208[1] == false) {
          pGVar6 = (GLFWmonitor *)0x0;
          iVar4 = iVar1;
          height = iVar2;
        }
        else {
          pGVar6 = (GLFWmonitor *)0x0;
        }
        handle = glfwCreateWindow(iVar4,height,"Mesmerize",pGVar6,(GLFWwindow *)0x0);
        if (handle == (GLFWwindow *)0x0) {
          glfwTerminate();
        }
        else {
          glfwMakeContextCurrent(handle);
          glfwSetKeyCallback(handle,main::anon_class_1_0_00000001::__invoke);
          DeviceInformation::init((EVP_PKEY_CTX *)handle);
          iVar5 = glewInit();
          __stream = _stderr;
          if (iVar5 != 0) {
            uVar9 = glewGetErrorString(iVar5);
            fprintf(__stream,"Error: %s\n",uVar9);
          }
          do {
            iVar5 = glGetError();
          } while (iVar5 != 0);
          glEnable(0xbe2);
          bVar3 = GlLogCall("glEnable(GL_BLEND)",(char *)0x7a,lineNo);
          if (!bVar3) {
            raise(5);
          }
          do {
            iVar5 = glGetError();
          } while (iVar5 != 0);
          glBlendFunc(0x302,0x303);
          bVar3 = GlLogCall("glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA)",(char *)0x7b,
                            lineNo_00);
          if (!bVar3) {
            raise(5);
          }
          do {
            iVar5 = glGetError();
          } while (iVar5 != 0);
          (*___glewBlendEquation)(0x8006);
          bVar3 = GlLogCall("glBlendEquation(GL_FUNC_ADD)",(char *)0x7c,lineNo_01);
          if (!bVar3) {
            raise(5);
          }
          Picture::InitShaders();
          glfwSwapInterval(1);
          local_1b8._M_unused._M_object = (void *)0x0;
          local_1b8._8_8_ = 0;
          local_1a8 = (code *)0x0;
          pcStack_1a0 = (code *)0x0;
          local_1b8._M_unused._M_object = operator_new(0x18);
          *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            **)local_1b8._M_unused._0_8_ = &local_198;
          *(_Any_data **)((long)local_1b8._M_unused._0_8_ + 8) = &local_180;
          *(undefined1 **)((long)local_1b8._M_unused._0_8_ + 0x10) = local_138;
          pcStack_1a0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp:134:31)>
                        ::_M_invoke;
          local_1a8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp:134:31)>
                      ::_M_manager;
          ManualTicker::ManualTicker
                    ((ManualTicker *)&local_180,(function<void_()> *)&local_1b8,(double)iStack_1fc);
          if (local_1a8 != (code *)0x0) {
            (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
          }
          while (iVar5 = glfwWindowShouldClose(handle), iVar5 == 0) {
            ManualTicker::Tick((ManualTicker *)&local_180);
            Renderer::Clear(&local_209);
            PictureRendererWithTransition::Render((PictureRendererWithTransition *)local_138);
            glfwSwapBuffers(handle);
            glfwPollEvents();
          }
          glfwTerminate();
          if (local_170 != (code *)0x0) {
            (*local_170)(&local_180,&local_180,__destroy_functor);
          }
          iVar5 = 0;
        }
      }
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
      }
      lVar10 = 0x60;
      do {
        Picture::~Picture((Picture *)(local_138 + lVar10));
        lVar10 = lVar10 + -0x60;
      } while (lVar10 != -0x60);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    return iVar5;
  }
  MesmerizeOptions::PrintOptions();
  exit(0);
}

Assistant:

int main(int argc, const char** argv)
{
    if (argc == 1){
        MesmerizeOptions::PrintOptions();
        exit(0);
    }

    MesmerizeOptions options;
    try {
        options = MesmerizeOptions::FromArgs(argc, argv);
    }catch(std::runtime_error e) {
        std::cout << "Unknown option: " << e.what() << "\n\n";
        MesmerizeOptions::PrintOptions();
        exit(1);
    }

    auto picturePaths = GetShuffledPicturePaths::GetShuffledPicturePaths(options.PathToPicturesFolder);
    if (picturePaths.empty()) {
        std::cout << "Folder " << options.PathToPicturesFolder << " has no pictures (.jpg or .png)\n";
        return 0;
    }

    PictureRendererWithTransition pictureRendererWithTransition(
            options.PanAnimationDuration,
            options.ZoomAnimationDuration,
            options.OpacityAnimationDuration,
            options.PanPercentage,
            options.ZoomPercentage);

    GLFWwindow *window;

    /* Initialize the library */
    if (!glfwInit())
        return -1;

    const GLFWvidmode *vidMode = glfwGetVideoMode(glfwGetPrimaryMonitor());
    int deviceWidth = vidMode->width;
    int deviceHeight = vidMode->height;

    if (options.IsFullScreen) {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", glfwGetPrimaryMonitor(), NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", glfwGetPrimaryMonitor(),NULL);
        }
    }else {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", NULL, NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", NULL, NULL);
        }
    }

    if (!window)
    {
        glfwTerminate();
        return -1;
    }
    /* Make the window's context current */
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
        if (key == GLFW_KEY_ESCAPE){
#ifdef ENABLE_IMGUI
            GL_CALL(ImGui_ImplGlfw_Shutdown());
            GL_CALL(ImGui_ImplOpenGL3_Shutdown());
            GL_CALL(ImGui::DestroyContext());
#endif
            glfwTerminate();
            exit(0);
        }
    });

    DeviceInformation::init(window, deviceWidth, deviceHeight);

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui::CreateContext());
    GL_CALL(ImGui_ImplGlfw_InitForOpenGL(window, true));
    GL_CALL(ImGui_ImplOpenGL3_Init("#version 300 es"));
#endif

    GLenum err = glewInit();

    if (GLEW_OK != err)
    {
        /* Problem: glewInit failed, something is seriously wrong. */
        fprintf(stderr, "Error: %s\n", glewGetErrorString(err));
    }

#if ENABLE_GL_DEBUG_OUTPUT
    fprintf(stdout, "Status: Using GLEW %s\n", glewGetString(GLEW_VERSION));
    // During init, enable debug output
    GL_CALL(glEnable(GL_DEBUG_OUTPUT));
    GL_CALL(glDebugMessageCallback(MessageCallback, 0));
#endif

    GL_CALL(glEnable(GL_BLEND));
    GL_CALL(glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA));
    GL_CALL(glBlendEquation(GL_FUNC_ADD));


    Picture::InitShaders();

    glfwSwapInterval(1);

    Renderer renderer;
    /* Loop until the user closes the window */
    static int counter = 0;
    ManualTicker manualTicker([&] {
        int index = ++counter % picturePaths.size();
        manualTicker.Pause(15000); //some pictures take a considerable amount of time to load in the pi, more than 15 secs probably there was an error and the event is not coming
        pictureRendererWithTransition.Load(picturePaths[index], [&manualTicker]() {
            manualTicker.Resume();
        });
    }, options.DisplayPictureDuration);

    while (!glfwWindowShouldClose(window))
    {
        manualTicker.Tick(); //will trigger the change of picture if enough time has passed
        /* Render here */
        renderer.Clear();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui_ImplOpenGL3_NewFrame());
        GL_CALL(ImGui_ImplGlfw_NewFrame());
        GL_CALL(ImGui::NewFrame());
        {
            GL_CALL(ImGui::Begin("Debug"));

            if (ImGui::Button("<"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = --counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }

            ImGui::SameLine();
            if (ImGui::Button(">"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = ++counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }
            ImGui::SameLine();
            ImGui::Text("counter = %d", counter);

            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }
#endif

        pictureRendererWithTransition.Render();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui::Render());
        GL_CALL(ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData()));
#endif
        /* Swap front and back buffers */
        glfwSwapBuffers(window);

        /* Poll for and process events */
        glfwPollEvents();
    }

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui_ImplGlfw_Shutdown());
    GL_CALL(ImGui_ImplOpenGL3_Shutdown());
    GL_CALL(ImGui::DestroyContext());
#endif
    glfwTerminate();
    return 0;
}